

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O3

void __thiscall btMatrixX<float>::resize(btMatrixX<float> *this,int rows,int cols)

{
  uint uVar1;
  float *ptr;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  int iVar5;
  
  this->m_resizeOperations = this->m_resizeOperations + 1;
  this->m_rows = rows;
  this->m_cols = cols;
  CProfileManager::Start_Profile("m_storage.resize");
  iVar5 = cols * rows;
  uVar1 = (this->m_storage).m_size;
  if (iVar5 <= (int)uVar1) goto LAB_001d05d1;
  if ((this->m_storage).m_capacity < iVar5) {
    if (iVar5 == 0) {
      pfVar3 = (float *)0x0;
      uVar2 = uVar1;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar5 * 4,0x10);
      uVar2 = (this->m_storage).m_size;
    }
    ptr = (this->m_storage).m_data;
    if ((int)uVar2 < 1) {
      if (ptr != (float *)0x0) goto LAB_001d05a3;
    }
    else {
      uVar4 = 0;
      do {
        pfVar3[uVar4] = ptr[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
LAB_001d05a3:
      if ((this->m_storage).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->m_storage).m_ownsMemory = true;
    (this->m_storage).m_data = pfVar3;
    (this->m_storage).m_capacity = iVar5;
  }
  else {
    pfVar3 = (this->m_storage).m_data;
  }
  memset(pfVar3 + (int)uVar1,0,((long)iVar5 - (long)(int)uVar1) * 4);
LAB_001d05d1:
  (this->m_storage).m_size = iVar5;
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void resize(int rows, int cols)
	{
		m_resizeOperations++;
		m_rows = rows;
		m_cols = cols;
		{
			BT_PROFILE("m_storage.resize");
			m_storage.resize(rows*cols);
		}
	}